

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplePartitionMap.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::Encodings::Apple::
PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::convert_source_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider> *this,
          ssize_t source_address,vector<unsigned_char,_std::allocator<unsigned_char>_> *source_data)

{
  uint uVar1;
  undefined4 uVar2;
  char *pcVar3;
  value_type_conflict3 *__val_1;
  long lVar4;
  pointer puVar5;
  size_t sVar6;
  uchar uVar7;
  value_type_conflict3 *__val;
  initializer_list<unsigned_char> __l;
  Partition partitions [3];
  allocator_type local_99;
  undefined8 local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 local_84;
  undefined1 uStack_80;
  undefined1 local_7f;
  char *local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 local_60;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined1 local_40;
  
  if (source_address < 0) {
    if (source_address == -0x40) {
      lVar4 = this->number_of_blocks_ + 0x40;
      local_98 = (char *)CONCAT17((char)lVar4,
                                  CONCAT16((char)((ulong)lVar4 >> 8),
                                           CONCAT15((char)((ulong)lVar4 >> 0x10),
                                                    CONCAT14((char)((ulong)lVar4 >> 0x18),0x25245)))
                                 );
      local_90 = 0x1000100;
      uStack_8c = 0;
      uStack_88 = 0;
      local_84 = 0x4000;
      uStack_80 = 0;
      local_7f = 1;
      __l._M_len = 0x1a;
      __l._M_array = (iterator)&local_98;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__l,&local_99);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (__return_storage_ptr__,0x200);
    }
    else if ((ulong)source_address < 0xffffffffffffffc3) {
      local_98 = "ProDOS";
      local_90 = 0x4e142c;
      uStack_8c = 0;
      uStack_88 = 0x40;
      local_84 = (undefined4)this->number_of_blocks_;
      uStack_80 = 0xb7;
      local_78 = "Apple";
      local_70 = "Apple_partition_map";
      local_68 = 0x3f00000001;
      local_60 = 0x37;
      local_58 = "Macintosh";
      local_50 = "Apple_Driver";
      local_48 = 0x40;
      local_40 = 0x7f;
      puVar5 = (pointer)operator_new(0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar5;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar5 + 0x200;
      memset(puVar5 + 2,0,0x1fe);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = puVar5 + 0x200;
      puVar5[0] = 'P';
      puVar5[1] = 'M';
      puVar5[7] = '\x03';
      lVar4 = source_address * 0x20;
      uVar1 = *(uint *)(&stack0x00000758 + lVar4);
      *(uint *)(puVar5 + 8) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar2 = *(undefined4 *)(&stack0x0000075c + lVar4);
      uVar7 = (uchar)((uint)uVar2 >> 0x18);
      puVar5[0xc] = uVar7;
      puVar5[0x54] = uVar7;
      uVar7 = (uchar)((uint)uVar2 >> 0x10);
      puVar5[0xd] = uVar7;
      puVar5[0x55] = uVar7;
      uVar7 = (uchar)((uint)uVar2 >> 8);
      puVar5[0xe] = uVar7;
      puVar5[0x56] = uVar7;
      puVar5[0xf] = (uchar)uVar2;
      puVar5[0x57] = (uchar)uVar2;
      pcVar3 = *(char **)(&stack0x00000748 + lVar4);
      sVar6 = strlen(pcVar3);
      memcpy(puVar5 + 0x10,pcVar3,sVar6);
      pcVar3 = *(char **)(&stack0x00000750 + lVar4);
      sVar6 = strlen(pcVar3);
      memcpy(puVar5 + 0x30,pcVar3,sVar6);
      puVar5[0x5b] = (&stack0x00000760)[lVar4];
    }
    else {
      puVar5 = (pointer)operator_new(0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar5;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar5 + 0x200;
      memset(puVar5,0,0x200);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = puVar5 + 0x200;
    }
  }
  else {
    puVar5 = (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar5;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (source_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convert_source_block(ssize_t source_address, std::vector<uint8_t> source_data = {}) {
			// Addresses greater than or equal to zero map to the actual disk image.
			if(source_address >= 0) return source_data;

			// Switch to mapping relative to 0, for personal sanity.
			source_address += non_volume_blocks();

			// Block 0 is the device descriptor, which lists the total number of blocks,
			// and provides an offset to the driver, if any.
			if(!source_address) {
				const uint32_t total_device_blocks = uint32_t(get_number_of_blocks());
				const auto driver_size = uint16_t(driver_block_size());
				const auto driver_offset = uint16_t(predriver_blocks());
				const uint8_t driver_count = driver_size > 0 ? 1 : 0;

				/* The driver descriptor. */
				std::vector<uint8_t> driver_description = {
					0x45, 0x52,		/* device signature */
					0x02, 0x00,		/* block size, in bytes */

					uint8_t(total_device_blocks >> 24),
					uint8_t(total_device_blocks >> 16),
					uint8_t(total_device_blocks >> 8),
					uint8_t(total_device_blocks),
									/* number of blocks on device */

					0x00, 0x01,		/* reserved (formerly: device type) */
					0x00, 0x01,		/* reserved (formerly: device ID) */
					0x00, 0x00,
					0x00, 0x00,		/* reserved ('sbData', no further explanation given) */

					0x00, driver_count,		/* number of device descriptor entries */
					0x00, 0x00,

					/* first device descriptor's starting block */
					uint8_t(driver_offset >> 8), uint8_t(driver_offset),

					/* size of device driver */
					uint8_t(driver_size >> 8), uint8_t(driver_size),

					0x00, 0x01,		/*
										More modern documentation: operating system (MacOS = 1)
										Inside Macintosh IV: system type (Mac Plus = 1)
									*/
				};
				driver_description.resize(512);

				return driver_description;
			}

			// Blocks 1 and 2 contain entries of the partition map; there's also possibly an entry
			// for the driver.
			if(source_address < 3 + volume_provider_.HasDriver) {
				struct Partition {
					const char *name, *type;
					uint32_t start_block, size;
					uint8_t status;
				} partitions[3] = {
					{
						volume_provider_.name(),
						volume_provider_.type(),
						uint32_t(non_volume_blocks()),
						uint32_t(number_of_blocks_),
						0xb7
					},
					{
						"Apple",
						"Apple_partition_map",
						0x01,
						uint32_t(predriver_blocks()) - 1,
						0x37
					},
					{
						"Macintosh",
						"Apple_Driver",
						uint32_t(predriver_blocks()),
						uint32_t(driver_block_size()),
						0x7f
					},
				};

				std::vector<uint8_t> partition(512);

				// Fill in the fixed fields.
				partition[0] = 'P';	partition[1] = 'M';	/* Signature. */
				partition[7] = 3;						/* Number of partitions. */

				const Partition &details = partitions[source_address-1];

				partition[8] = uint8_t(details.start_block >> 24);
				partition[9] = uint8_t(details.start_block >> 16);
				partition[10] = uint8_t(details.start_block >> 8);
				partition[11] = uint8_t(details.start_block);

				partition[84] = partition[12] = uint8_t(details.size >> 24);
				partition[85] = partition[13] = uint8_t(details.size >> 16);
				partition[86] = partition[14] = uint8_t(details.size >> 8);
				partition[87] = partition[15] = uint8_t(details.size);

				// 32 bytes are allocated for each of the following strings.
				memcpy(&partition[16], details.name, strlen(details.name));
				memcpy(&partition[48], details.type, strlen(details.type));

				partition[91] = details.status;

				// The third entry in this constructed partition map is the driver;
				// add some additional details.
				if constexpr (VolumeProvider::HasDriver) {
					if(source_address == 3) {
						const auto driver_size = uint16_t(volume_provider_.driver_size());
						const auto driver_checksum = uint16_t(volume_provider_.driver_checksum());

						/* Driver size in bytes. */
						partition[98] = uint8_t(driver_size >> 8);
						partition[99] = uint8_t(driver_size);

						/* Driver checksum. */
						partition[118] = uint8_t(driver_checksum >> 8);
						partition[119] = uint8_t(driver_checksum);

						/* Driver target processor. */
						const char *driver_target = volume_provider_.driver_target();
						memcpy(&partition[120], driver_target, strlen(driver_target));

						// Various non-zero values that Apple HD SC Tool wrote are below; they are
						// documented as reserved officially, so I don't know their meaning.
						partition[137] = 0x01;
						partition[138] = 0x06;
						partition[143] = 0x01;
						partition[147] = 0x02;
						partition[149] = 0x07;
					}
				}

				return partition;
			}

			if constexpr (VolumeProvider::HasDriver) {
				// The remainder of the non-volume area is the driver.
				if(source_address >= predriver_blocks() && source_address < non_volume_blocks()) {
					const uint8_t *driver = volume_provider_.driver();
					const auto offset = (source_address - predriver_blocks()) * 512;
					return std::vector<uint8_t>(&driver[offset], &driver[offset + 512]);
				}
			}

			// Default: return an empty block.
			return std::vector<uint8_t>(512);
		}